

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O1

void __thiscall fmcalc::init_programme(fmcalc *this,int maxRunLevel)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_01;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *this_02;
  vector<int,std::allocator<int>> *this_03;
  int *piVar1;
  vector<int,_std::allocator<int>_> *this_04;
  pointer piVar2;
  pointer pvVar3;
  pointer pvVar4;
  iterator __position;
  long *plVar5;
  FILE *__stream;
  size_t sVar6;
  undefined8 extraout_RAX;
  long *plVar7;
  long lVar8;
  fm_programme f;
  string file;
  undefined8 local_98;
  long local_90;
  long local_88;
  long lStack_80;
  undefined1 local_78 [40];
  value_type_conflict1 local_50 [4];
  undefined1 local_40 [16];
  
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input/fm_programme.bin","");
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_78);
    plVar5 = (long *)std::__cxx11::string::replace
                               ((ulong)local_50,0,(char *)0x0,
                                (ulong)(this->inputpath_)._M_dataplus._M_p);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_88 = *plVar7;
      lStack_80 = plVar5[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar7;
      local_98 = (long *)*plVar5;
    }
    local_90 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_78,(string *)&local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    if ((undefined1 *)CONCAT44(local_50[1],local_50[0]) != local_40) {
      operator_delete((undefined1 *)CONCAT44(local_50[1],local_50[0]));
    }
  }
  __stream = fopen((char *)local_78._0_8_,"rb");
  if (__stream == (FILE *)0x0) {
    init_programme((fmcalc *)local_78);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_);
    }
    _Unwind_Resume(extraout_RAX);
  }
  if (maxRunLevel != -1) {
    this->maxRunLevel_ = maxRunLevel;
  }
  this_00 = &this->level_to_maxagg_id_;
  if ((this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_50[0] = -1;
    std::vector<int,_std::allocator<int>_>::resize(this_00,1,local_50);
  }
  sVar6 = fread(&local_98,0xc,1,__stream);
  if (sVar6 != 0) {
    this_01 = &this->pfm_vec_vec_;
    this_02 = &this->node_to_direct_sub_nodes_vec_;
    local_78._32_8_ = &this->node_to_coverage_ids_;
    do {
      if (local_98._4_4_ <= this->maxRunLevel_) {
        if (this->maxLevel_ < local_98._4_4_) {
          this->maxLevel_ = local_98._4_4_;
          local_50[0] = -1;
          std::vector<int,_std::allocator<int>_>::resize(this_00,(long)local_98._4_4_ + 1,local_50);
        }
        if (local_98._4_4_ == 1) {
          piVar1 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (*piVar1 < (int)local_98) {
            *piVar1 = (int)local_98;
          }
          if ((this->pfm_vec_vec_).
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->pfm_vec_vec_).
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::resize(this_01,1);
          }
          this_04 = (this_01->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this_04->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this_04->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2) < (long)(int)local_98 + 1U) {
            std::vector<int,_std::allocator<int>_>::resize(this_04,(long)(int)local_98 + 1U);
          }
          *(int *)(*(long *)&(((this_01->
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data + (long)(int)local_98 * 4) = (int)local_98;
        }
        piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar2[local_98._4_4_] < (int)local_90) {
          piVar2[local_98._4_4_] = (int)local_90;
        }
        if ((ulong)(((long)(this->pfm_vec_vec_).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->pfm_vec_vec_).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <
            (long)local_98._4_4_ + 1U) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(this_01,(long)local_98._4_4_ + 1U);
        }
        lVar8 = (long)local_98._4_4_;
        pvVar3 = (this_01->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar3[lVar8].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + 8) -
                    *(long *)&pvVar3[lVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data >> 2) < (long)(int)local_98 + 1U) {
          std::vector<int,_std::allocator<int>_>::resize(pvVar3 + lVar8,(long)(int)local_98 + 1U);
        }
        *(int *)(*(long *)&(this_01->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[local_98._4_4_].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + (long)(int)local_98 * 4) = (int)local_90;
        if ((int)local_90 == 0) {
          init_programme();
        }
        if ((ulong)(((long)(this->node_to_direct_sub_nodes_vec_).
                           super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->node_to_direct_sub_nodes_vec_).
                           super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <
            (long)local_98._4_4_ + 1U) {
          std::
          vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          ::resize(this_02,(long)local_98._4_4_ + 1U);
          std::
          vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
          ::resize((vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                    *)local_78._32_8_,(long)local_98._4_4_ + 1);
        }
        lVar8 = (long)local_98._4_4_;
        pvVar4 = (this_02->
                 super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)*(pointer *)
                            ((long)&pvVar4[lVar8].
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data + 8) -
                     *(long *)&pvVar4[lVar8].
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555) <
            (long)(int)local_90 + 1U) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(pvVar4 + lVar8,(long)(int)local_90 + 1U);
          std::
          vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
          ::resize((this->node_to_coverage_ids_).
                   super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_98._4_4_,
                   (long)(int)local_90 + 1);
        }
        this_03 = (vector<int,std::allocator<int>> *)
                  (*(long *)&(this_02->
                             super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[local_98._4_4_].
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data + (long)(int)local_90 * 0x18);
        __position._M_current = *(int **)(this_03 + 8);
        if (__position._M_current == *(int **)(this_03 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_03,__position,(int *)&local_98);
        }
        else {
          *__position._M_current = (int)local_98;
          *(int **)(this_03 + 8) = __position._M_current + 1;
        }
      }
      sVar6 = fread(&local_98,0xc,1,__stream);
    } while (sVar6 != 0);
  }
  fclose(__stream);
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_);
  }
  return;
}

Assistant:

void fmcalc::init_programme(int maxRunLevel)
{

	FILE *fin = NULL;
	std::string file = FMPROGRAMME_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL){
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}

	fm_programme f;
    if (maxRunLevel != -1) maxRunLevel_ = maxRunLevel;

	if (level_to_maxagg_id_.size() == 0) {
		level_to_maxagg_id_.resize(1, -1);
	}
	size_t i = fread(&f, sizeof(f), 1, fin);
	while (i != 0) {
        if (f.level_id <= maxRunLevel_){
			if (maxLevel_ < f.level_id) {
				maxLevel_ = f.level_id;
				level_to_maxagg_id_.resize(maxLevel_ + 1, -1);
			}
			if (f.level_id == 1) {	
				if (f.from_agg_id > level_to_maxagg_id_[0])level_to_maxagg_id_[0] = f.from_agg_id;
				if (pfm_vec_vec_.size() < 1) {
					pfm_vec_vec_.resize(1);
				}
				if (pfm_vec_vec_[0].size() < (size_t)f.from_agg_id + 1) {
					pfm_vec_vec_[0].resize(f.from_agg_id + 1);
				}
				pfm_vec_vec_[0][f.from_agg_id] = f.from_agg_id;
			}					
			if (f.to_agg_id > level_to_maxagg_id_[f.level_id])level_to_maxagg_id_[f.level_id] = f.to_agg_id;
            if (pfm_vec_vec_.size() < (size_t)f.level_id + 1) {
                pfm_vec_vec_.resize(f.level_id + 1);
            }
            if (pfm_vec_vec_[f.level_id].size() < (size_t)f.from_agg_id + 1) {
                pfm_vec_vec_[f.level_id].resize(f.from_agg_id + 1);
            }
            pfm_vec_vec_[f.level_id][f.from_agg_id] = f.to_agg_id;
            if (f.to_agg_id == 0) {
                fprintf(stderr, "FATAL: Invalid agg id from fm_programme.bin\n");
            }

	    // Fill node_to_direct_sub_nodes_vec_[level_id][to_agg_id] = vector<int>(from_agg_id)
	    if (node_to_direct_sub_nodes_vec_.size() < (size_t)f.level_id + 1) {
		node_to_direct_sub_nodes_vec_.resize(f.level_id + 1);
		node_to_coverage_ids_.resize(f.level_id + 1);
	    }
	    if (node_to_direct_sub_nodes_vec_[f.level_id].size() < (size_t)f.to_agg_id + 1) {
		node_to_direct_sub_nodes_vec_[f.level_id].resize(f.to_agg_id + 1);
		node_to_coverage_ids_[f.level_id].resize(f.to_agg_id + 1);
	    }
	    node_to_direct_sub_nodes_vec_[f.level_id][f.to_agg_id].push_back(f.from_agg_id);
        }
		i = fread(&f, sizeof(f), 1, fin);
	}
	fclose(fin);

}